

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tls_connection.cc
# Opt level: O0

int __thiscall AliTlsConnection::Connect(AliTlsConnection *this)

{
  int iVar1;
  size_t len;
  char *host;
  int flags;
  int ret;
  char *pers;
  char sz_port [16];
  AliTlsConnection *this_local;
  
  sz_port._8_8_ = this;
  memset(&pers,0,0x10);
  snprintf((char *)&pers,0x10,"%d",(ulong)(uint)this->port_);
  mbedtls_net_init(&this->server_fd_);
  mbedtls_ssl_init(&this->ssl_);
  mbedtls_ssl_config_init(&this->conf_);
  mbedtls_x509_crt_init(&this->cacert_);
  mbedtls_ctr_drbg_init(&this->ctr_drbg_);
  mbedtls_entropy_init(&this->entropy_);
  len = strlen("ssl_client_aliyun");
  iVar1 = mbedtls_ctr_drbg_seed
                    (&this->ctr_drbg_,mbedtls_entropy_func,&this->entropy_,
                     (uchar *)"ssl_client_aliyun",len);
  if ((iVar1 == 0) &&
     (iVar1 = mbedtls_x509_crt_parse
                        (&this->cacert_,
                         (uchar *)
                         "-----BEGIN CERTIFICATE-----\r\nMIIDhzCCAm+gAwIBAgIBADANBgkqhkiG9w0BAQUFADA7MQswCQYDVQQGEwJOTDER\r\nMA8GA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwHhcN\r\nMTEwMjEyMTQ0NDAwWhcNMjEwMjEyMTQ0NDAwWjA7MQswCQYDVQQGEwJOTDERMA8G\r\nA1UEChMIUG9sYXJTU0wxGTAXBgNVBAMTEFBvbGFyU1NMIFRlc3QgQ0EwggEiMA0G\r\nCSqGSIb3DQEBAQUAA4IBDwAwggEKAoIBAQDA3zf8F7vglp0/ht6WMn1EpRagzSHx\r\nmdTs6st8GFgIlKXsm8WL3xoemTiZhx57wI053zhdcHgH057Zk+i5clHFzqMwUqny\r\n50BwFMtEonILwuVA+T7lpg6z+exKY8C4KQB0nFc7qKUEkHHxvYPZP9al4jwqj+8n\r\nYMPGn8u67GB9t+aEMr5P+1gmIgNb1LTV+/Xjli5wwOQuvfwu7uJBVcA0Ln0kcmnL\r\nR7EUQIN9Z/SG9jGr8XmksrUuEvmEF/Bibyc+E1ixVA0hmnM3oTDPb5Lc9un8rNsu\r\nKNF+AksjoBXyOGVkCeoMbo4bF6BxyLObyavpw/LPh5aPgAIynplYb6LVAgMBAAGj\r\ngZUwgZIwDAYDVR0TBAUwAwEB/zAdBgNVHQ4EFgQUtFrkpbPe0lL2udWmlQ/rPrzH\r\n/f8wYwYDVR0jBFwwWoAUtFrkpbPe0lL2udWmlQ/rPrzH/f+hP6Q9MDsxCzAJBgNV\r\nBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEZMBcGA1UEAxMQUG9sYXJTU0wgVGVz\r\ndCBDQYIBADANBgkqhkiG9w0BAQUFAAOCAQEAuP1U2ABUkIslsCfdlc2i94QHHYeJ\r\nSsR4EdgHtdciUI5I62J6Mom+Y0dT/7a+8S6MVMCZP6C5NyNyXw1GWY/YR82XTJ8H\r\nDBJiCTok5DbZ6SzaONBzdWHXwWwmi5vg1dxn7YxrM9d0IjxM27WNKs4sDQhZBQkF\r\npjmfs2cb4oPl4Y9T9meTx/lvdkRYEug61Jfn6cA+qHpyPYdTH+UshITnmp5/Ztkf\r\nm/UTSLBNFNHesiTZeH31NcxYGdHSme9Nc/gfidRa0FLOCfWxRlFqAI47zG9jAQCZ\r\n7Z2mCGDNMhjQc+BYcdnl0lPXjdDK6V0qCg1dVewhUBcW5gZKzV7e9+DpVA==\r\n-----END CERTIFICATE-----\r\n-----BEGIN CERTIFICATE-----\r\nMIICUjCCAdegAwIBAgIJAMFD4n5iQ8zoMAoGCCqGSM49BAMCMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTAeFw0xMzA5MjQxNTQ5NDhaFw0yMzA5MjIxNTQ5NDhaMD4xCzAJBgNVBAYT\r\nAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UEAxMTUG9sYXJzc2wgVGVzdCBF\r\nQyBDQTB2MBAGByqGSM49AgEGBSuBBAAiA2IABMPaKzRBN1gvh1b+/Im6KUNLTuBu\r\nww5XUzM5WNRStJGVOQsj318XJGJI/BqVKc4sLYfCiFKAr9ZqqyHduNMcbli4yuiy\r\naY7zQa0pw7RfdadHb9UZKVVpmlM7ILRmFmAzHqOBoDCBnTAdBgNVHQ4EFgQUnW0g\r\nJEkBPyvLeLUZvH4kydv7NnwwbgYDVR0jBGcwZYAUnW0gJEkBPyvLeLUZvH4kydv7\r\nNnyhQqRAMD4xCzAJBgNVBAYTAk5MMREwDwYDVQQKEwhQb2xhclNTTDEcMBoGA1UE\r\nAxMTUG9sYXJzc2wgVGVzdCBFQyBDQYIJAMFD4n5iQ8zoMAwGA1UdEwQFMAMBAf8w\r\nCgYIKoZIzj0EAwIDaQAwZgIxAMO0YnNWKJUAfXgSJtJxexn4ipg+k..." /* TRUNCATED STRING LITERAL */
                         ,0x88d), -1 < iVar1)) {
    host = (char *)std::__cxx11::string::c_str();
    iVar1 = mbedtls_net_connect(&this->server_fd_,host,(char *)&pers,0);
    if ((iVar1 == 0) && (iVar1 = mbedtls_ssl_config_defaults(&this->conf_,0,0,0), iVar1 == 0)) {
      mbedtls_ssl_conf_authmode(&this->conf_,1);
      mbedtls_ssl_conf_ca_chain(&this->conf_,&this->cacert_,(mbedtls_x509_crl *)0x0);
      mbedtls_ssl_conf_rng(&this->conf_,mbedtls_ctr_drbg_random,&this->ctr_drbg_);
      iVar1 = mbedtls_ssl_setup(&this->ssl_,&this->conf_);
      if ((iVar1 == 0) &&
         (iVar1 = mbedtls_ssl_set_hostname(&this->ssl_,"mbed TLS Server 1"), iVar1 == 0)) {
        mbedtls_ssl_set_bio(&this->ssl_,&this->server_fd_,mbedtls_net_send,mbedtls_net_recv,
                            (_func_int_void_ptr_uchar_ptr_size_t_uint32_t *)0x0);
        do {
          iVar1 = mbedtls_ssl_handshake(&this->ssl_);
          if (iVar1 == 0) {
            return 0;
          }
        } while ((iVar1 == -0x6900) || (iVar1 == -0x6880));
      }
    }
  }
  return -1;
}

Assistant:

int AliTlsConnection::Connect() {
  
  char sz_port[16] = {};
  const char *pers = "ssl_client_aliyun";
  int ret;
  int flags;
  snprintf(sz_port, sizeof(sz_port), "%d", this->port_);
  mbedtls_net_init( &server_fd_ );
  mbedtls_ssl_init( &ssl_ );
  mbedtls_ssl_config_init( &conf_ );
  mbedtls_x509_crt_init( &cacert_ );
  mbedtls_ctr_drbg_init( &ctr_drbg_ );
  mbedtls_entropy_init( &entropy_ );

  if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg_, mbedtls_entropy_func, &entropy_,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
  {
        return -1;
  }


  ret = mbedtls_x509_crt_parse( &cacert_, (const unsigned char *) mbedtls_test_cas_pem,
                          mbedtls_test_cas_pem_len );
  if( ret < 0 )
  {
      return -1;
  }

  if( ( ret = mbedtls_net_connect(&server_fd_, host_.c_str(), sz_port, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
  {
      return -1;
  }
  
  if( ( ret = mbedtls_ssl_config_defaults( &conf_,
                    MBEDTLS_SSL_IS_CLIENT,
                    MBEDTLS_SSL_TRANSPORT_STREAM,
                    MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
  {
      return -1;
  }

  mbedtls_ssl_conf_authmode( &conf_, MBEDTLS_SSL_VERIFY_OPTIONAL );
  mbedtls_ssl_conf_ca_chain( &conf_, &cacert_, NULL );
  mbedtls_ssl_conf_rng( &conf_, mbedtls_ctr_drbg_random, &ctr_drbg_ );

  if( ( ret = mbedtls_ssl_setup( &ssl_, &conf_ ) ) != 0 )
  {
      return -1;
  }

  if( ( ret = mbedtls_ssl_set_hostname( &ssl_, "mbed TLS Server 1" ) ) != 0 )
  {
      return -1;
  }

  mbedtls_ssl_set_bio( &ssl_, &server_fd_, mbedtls_net_send, mbedtls_net_recv, NULL );
  while( ( ret = mbedtls_ssl_handshake( &ssl_ ) ) != 0 )
  {
      if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
      {
          return -1;
      }
  }

  return 0;
}